

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::InternalSwap
          (UniDirectionalLSTMLayerParams *this,UniDirectionalLSTMLayerParams *other)

{
  UniDirectionalLSTMLayerParams *other_local;
  UniDirectionalLSTMLayerParams *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(other->activations_).super_RepeatedPtrFieldBase);
  std::swap<CoreML::Specification::LSTMParams*>(&this->params_,&other->params_);
  std::swap<CoreML::Specification::LSTMWeightParams*>(&this->weightparams_,&other->weightparams_);
  std::swap<unsigned_long>(&this->inputvectorsize_,&other->inputvectorsize_);
  std::swap<unsigned_long>(&this->outputvectorsize_,&other->outputvectorsize_);
  std::swap<bool>(&this->reverseinput_,&other->reverseinput_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::InternalSwap(UniDirectionalLSTMLayerParams* other) {
  activations_.InternalSwap(&other->activations_);
  std::swap(params_, other->params_);
  std::swap(weightparams_, other->weightparams_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(reverseinput_, other->reverseinput_);
  std::swap(_cached_size_, other->_cached_size_);
}